

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utxo_snapshot.h
# Opt level: O2

void __thiscall node::SnapshotMetadata::Unserialize<AutoFile>(SnapshotMetadata *this,AutoFile *s)

{
  long lVar1;
  bool bVar2;
  const_iterator cVar3;
  uint64_t uVar4;
  optional<ChainType> oVar5;
  char *pcVar6;
  string *psVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  long in_FS_OFFSET;
  uint16_t version;
  MessageStartChars message;
  array<unsigned_char,_5UL> snapshot_magic;
  string local_90;
  string node_network_string;
  string network_string;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Unserialize<AutoFile,_unsigned_char,_5UL>(s,&snapshot_magic);
  bVar2 = std::operator==(&snapshot_magic,&SNAPSHOT_MAGIC_BYTES);
  if (bVar2) {
    version = ser_readdata16<AutoFile>(s);
    cVar3 = std::
            _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
            ::find((_Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
                    *)this,&version);
    if ((_Rb_tree_header *)cVar3._M_node ==
        &(this->m_supported_versions)._M_t._M_impl.super__Rb_tree_header) {
      psVar7 = (string *)__cxa_allocate_exception(0x20);
      tinyformat::format<unsigned_short>
                (&network_string,
                 "Version of snapshot %s does not match any of the supported versions.",&version);
      std::ios_base::failure[abi:cxx11]::failure(psVar7);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(psVar7,&std::ios_base::failure[abi:cxx11]::typeinfo,
                    std::ios_base::failure[abi:cxx11]::~failure);
      }
    }
    else {
      Unserialize<AutoFile,_unsigned_char,_4UL>(s,&message);
      bVar2 = std::__equal<true>::equal<unsigned_char>
                        (message._M_elems,snapshot_magic._M_elems,(this->m_network_magic)._M_elems);
      if (bVar2) {
        base_blob<256U>::Unserialize<AutoFile>(&(this->m_base_blockhash).super_base_blob<256U>,s);
        uVar4 = ser_readdata64<AutoFile>(s);
        this->m_coins_count = uVar4;
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          return;
        }
      }
      else {
        oVar5 = GetNetworkForMagic(&message);
        if (((ulong)oVar5.super__Optional_base<ChainType,_true,_true>._M_payload.
                    super__Optional_payload_base<ChainType> >> 0x20 & 1) == 0) {
          pcVar6 = (char *)__cxa_allocate_exception(0x20);
          network_string._M_string_length = std::iostream_category();
          network_string._M_dataplus._M_p._0_4_ = 1;
          std::ios_base::failure[abi:cxx11]::failure
                    (pcVar6,(error_code *)
                            "This snapshot has been created for an unrecognized network. This could be a custom signet, a new testnet or possibly caused by data corruption."
                    );
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            __cxa_throw(pcVar6,&std::ios_base::failure[abi:cxx11]::typeinfo,
                        std::ios_base::failure[abi:cxx11]::~failure);
          }
        }
        else {
          ChainTypeToString_abi_cxx11_
                    (&network_string,
                     oVar5.super__Optional_base<ChainType,_true,_true>._M_payload.
                     super__Optional_payload_base<ChainType>._M_payload);
          oVar5 = GetNetworkForMagic(&this->m_network_magic);
          if (((ulong)oVar5.super__Optional_base<ChainType,_true,_true>._M_payload.
                      super__Optional_payload_base<ChainType> & 0x100000000) == 0) {
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
              std::__throw_bad_optional_access();
            }
          }
          else {
            ChainTypeToString_abi_cxx11_
                      (&node_network_string,
                       oVar5.super__Optional_base<ChainType,_true,_true>._M_payload.
                       super__Optional_payload_base<ChainType>._M_payload);
            psVar7 = (string *)__cxa_allocate_exception(0x20);
            tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                      (&local_90,
                       (tinyformat *)
                       "The network of the snapshot (%s) does not match the network of this node (%s)."
                       ,(char *)&network_string,&node_network_string,in_R8);
            std::ios_base::failure[abi:cxx11]::failure(psVar7);
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
              __cxa_throw(psVar7,&std::ios_base::failure[abi:cxx11]::typeinfo,
                          std::ios_base::failure[abi:cxx11]::~failure);
            }
          }
        }
      }
    }
  }
  else {
    pcVar6 = (char *)__cxa_allocate_exception(0x20);
    network_string._M_string_length = std::iostream_category();
    network_string._M_dataplus._M_p._0_4_ = 1;
    std::ios_base::failure[abi:cxx11]::failure
              (pcVar6,(error_code *)
                      "Invalid UTXO set snapshot magic bytes. Please check if this is indeed a snapshot file or if you are using an outdated snapshot format."
              );
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(pcVar6,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  __stack_chk_fail();
}

Assistant:

inline void Unserialize(Stream& s) {
        // Read the snapshot magic bytes
        std::array<uint8_t, SNAPSHOT_MAGIC_BYTES.size()> snapshot_magic;
        s >> snapshot_magic;
        if (snapshot_magic != SNAPSHOT_MAGIC_BYTES) {
            throw std::ios_base::failure("Invalid UTXO set snapshot magic bytes. Please check if this is indeed a snapshot file or if you are using an outdated snapshot format.");
        }

        // Read the version
        uint16_t version;
        s >> version;
        if (m_supported_versions.find(version) == m_supported_versions.end()) {
            throw std::ios_base::failure(strprintf("Version of snapshot %s does not match any of the supported versions.", version));
        }

        // Read the network magic (pchMessageStart)
        MessageStartChars message;
        s >> message;
        if (!std::equal(message.begin(), message.end(), m_network_magic.data())) {
            auto metadata_network{GetNetworkForMagic(message)};
            if (metadata_network) {
                std::string network_string{ChainTypeToString(metadata_network.value())};
                auto node_network{GetNetworkForMagic(m_network_magic)};
                std::string node_network_string{ChainTypeToString(node_network.value())};
                throw std::ios_base::failure(strprintf("The network of the snapshot (%s) does not match the network of this node (%s).", network_string, node_network_string));
            } else {
                throw std::ios_base::failure("This snapshot has been created for an unrecognized network. This could be a custom signet, a new testnet or possibly caused by data corruption.");
            }
        }

        s >> m_base_blockhash;
        s >> m_coins_count;
    }